

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::AddGenerators
          (MessageGenerator *this,
          vector<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
          *enum_generators,
          vector<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          *extension_generators)

{
  pointer *pppEVar1;
  pointer *pppEVar2;
  iterator __position;
  iterator __position_00;
  ExtensionGenerator *in_RAX;
  scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator> *psVar3;
  scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator> *psVar4;
  long lVar5;
  ExtensionGenerator *local_38;
  
  local_38 = in_RAX;
  if (0 < *(int *)(this->descriptor_ + 0x58)) {
    lVar5 = 0;
    do {
      psVar3 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::EnumGenerator>_>
               ::operator[](&this->enum_generators_,lVar5);
      local_38 = (ExtensionGenerator *)psVar3->ptr_;
      __position._M_current =
           (enum_generators->
           super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (enum_generators->
          super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::EnumGenerator*>
                  ((vector<google::protobuf::compiler::cpp::EnumGenerator*,std::allocator<google::protobuf::compiler::cpp::EnumGenerator*>>
                    *)enum_generators,__position,(EnumGenerator **)&local_38);
      }
      else {
        *__position._M_current = (EnumGenerator *)local_38;
        pppEVar1 = &(enum_generators->
                    super__Vector_base<google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<google::protobuf::compiler::cpp::EnumGenerator_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar1 = *pppEVar1 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(this->descriptor_ + 0x58));
  }
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    lVar5 = 0;
    do {
      psVar4 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ::operator[](&this->extension_generators_,lVar5);
      local_38 = psVar4->ptr_;
      __position_00._M_current =
           (extension_generators->
           super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (extension_generators->
          super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
        ::_M_realloc_insert<google::protobuf::compiler::cpp::ExtensionGenerator*>
                  ((vector<google::protobuf::compiler::cpp::ExtensionGenerator*,std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator*>>
                    *)extension_generators,__position_00,&local_38);
      }
      else {
        *__position_00._M_current = local_38;
        pppEVar2 = &(extension_generators->
                    super__Vector_base<google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + 1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < *(int *)(this->descriptor_ + 0x78));
  }
  return;
}

Assistant:

void MessageGenerator::AddGenerators(
    std::vector<EnumGenerator*>* enum_generators,
    std::vector<ExtensionGenerator*>* extension_generators) {
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators->push_back(enum_generators_[i].get());
  }
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators->push_back(extension_generators_[i].get());
  }
}